

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ChNodeFEAxyzrot(ChNodeFEAxyzrot *this,ChFrame<double> *initialf)

{
  undefined1 *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChVector<double> local_c8;
  ChFrame<double> local_b0;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x2b8);
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  this->super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0x1178b88;
  *(undefined8 *)&this->field_0x2b8 = 0x1178c88;
  ChBodyFrame::ChBodyFrame((ChBodyFrame *)this_00);
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0x1178698;
  *(undefined8 *)&this->field_0x2b8 = 0x1178a78;
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x18 = 0x1178808;
  (this->super_ChVariableTupleCarrier_1vars<6>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x228);
  this->super_ChLoadableUVW = (ChLoadableUVW)0x1178930;
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  local_c8.m_data[2] = 0.0;
  local_b0._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_b0.coord.pos.m_data[2] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame(&this->X0,&local_c8,(ChQuaternion<double> *)&local_b0);
  auVar1._8_8_ = DAT_011dd3e0;
  auVar1._0_8_ = VNULL;
  auVar3._8_8_ = DAT_011dd3e8;
  auVar3._0_8_ = DAT_011dd3e0;
  auVar2 = vunpcklpd_avx(auVar1,auVar3);
  auVar1 = vshufpd_avx(auVar3,auVar1,1);
  *(undefined1 (*) [16])((this->Force).m_data + 2) = auVar1;
  *(undefined1 (*) [16])(this->Force).m_data = auVar2;
  *(undefined1 (*) [16])((this->Torque).m_data + 1) = auVar3;
  ChFrameMoving<double>::operator=((ChFrameMoving<double> *)this_00,initialf);
  ChFrame<double>::ChFrame(&local_b0,initialf);
  ChFrame<double>::operator=(&this->X0,&local_b0);
  ChVariablesBodyOwnMass::SetBodyMass(&this->variables,0.0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&(this->variables).inertia);
  return;
}

Assistant:

ChNodeFEAxyzrot::ChNodeFEAxyzrot(ChFrame<> initialf) : Force(VNULL), Torque(VNULL) {
    this->Frame() = initialf;
    X0 = ChFrame<>(initialf);

    variables.SetBodyMass(0.0);
    variables.GetBodyInertia().setZero();
}